

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.h
# Opt level: O1

void TTD::SnapShot::
     EmitListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SlotArrayInfo,2048ul>
               (_func_void_SlotArrayInfo_ptr_FileWriter_ptr_Separator *emitFunc,
               UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *list,
               FileWriter *snapwriter)

{
  Separator SVar1;
  uint32 length;
  UnorderedArrayListLink *pUVar2;
  SlotArrayInfo *pSVar3;
  SlotArrayInfo *pSVar4;
  
  length = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count(list);
  FileWriter::WriteLengthValue(snapwriter,length,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(snapwriter,CommaAndBigSpaceSeparator);
  (*snapwriter->_vptr_FileWriter[8])(snapwriter,1);
  pSVar3 = (list->m_inlineHeadBlock).CurrPos;
  pSVar4 = (list->m_inlineHeadBlock).BlockData;
  if (pSVar4 != (SlotArrayInfo *)0x0 && pSVar4 != pSVar3) {
    pUVar2 = (list->m_inlineHeadBlock).Next;
    SVar1 = BigSpaceSeparator;
    do {
      (*emitFunc)(pSVar4,snapwriter,SVar1);
      pSVar4 = pSVar4 + 1;
      if (pSVar4 == pSVar3) {
        if (pUVar2 == (UnorderedArrayListLink *)0x0) {
          pSVar4 = (SlotArrayInfo *)0x0;
        }
        else {
          pSVar3 = pUVar2->CurrPos;
          pSVar4 = pUVar2->BlockData;
          pUVar2 = pUVar2->Next;
        }
      }
      SVar1 = CommaAndBigSpaceSeparator;
    } while (pSVar4 != (SlotArrayInfo *)0x0);
  }
  (*snapwriter->_vptr_FileWriter[8])(snapwriter,0xffffffff);
  (*snapwriter->_vptr_FileWriter[5])(snapwriter,2);
  return;
}

Assistant:

static void EmitListHelper(Fn emitFunc, const UnorderedArrayList<T, allocSize>& list, FileWriter* snapwriter)
        {
            snapwriter->WriteLengthValue(list.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
            snapwriter->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
            snapwriter->AdjustIndent(1);
            bool firstElement = true;
            for(auto iter = list.GetIterator(); iter.IsValid(); iter.MoveNext())
            {
                (*emitFunc)(iter.Current(), snapwriter, firstElement ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);
                firstElement = false;
            }
            snapwriter->AdjustIndent(-1);
            snapwriter->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
        }